

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

int __thiscall GrcManager::SlotAttributeIndex(GrcManager *this,Symbol psym)

{
  bool bVar1;
  int iVar2;
  Symbol pGVar3;
  
  bVar1 = GrcSymbolTableEntry::IsComponentRef(psym);
  if (bVar1) {
    pGVar3 = GrcSymbolTableEntry::BaseLigComponent(psym);
    if (pGVar3->m_fGeneric == false) {
      pGVar3 = pGVar3->m_psymGeneric;
    }
    iVar2 = pGVar3->m_nInternalID;
  }
  else {
    bVar1 = GrcSymbolTableEntry::IsUserDefinableSlotAttr(psym);
    iVar2 = 0;
    if (bVar1) {
      iVar2 = GrcSymbolTableEntry::UserDefinableSlotAttrIndex(psym);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int GrcManager::SlotAttributeIndex(Symbol psym)
{
	if (psym->IsComponentRef())
	{
		Symbol psymBase = psym->BaseLigComponent();
		if (!psymBase->IsGeneric())
			psymBase = psymBase->Generic();
		Assert(psymBase->IsGeneric());

		int nIDRet = psymBase->InternalID();
		Assert(nIDRet > -1);
		return nIDRet;
	}
	else if (psym->IsUserDefinableSlotAttr())
	{
		return psym->UserDefinableSlotAttrIndex();
	}
	else
	{
		//	No other kinds of indexed attributes so far.
		Assert(false);
	}
	return 0;
}